

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_get_current_device(cubeb_stream_conflict *stm,cubeb_device **device)

{
  cubeb_device *pcVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar1 = (cubeb_device *)calloc(1,0x10);
  *device = pcVar1;
  if (pcVar1 == (cubeb_device *)0x0) {
    iVar3 = -1;
  }
  else {
    if (stm->input_stream != (pa_stream *)0x0) {
      pcVar2 = (*cubeb_pa_stream_get_device_name)(stm->input_stream);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = strdup(pcVar2);
      }
      (*device)->input_name = pcVar2;
    }
    if (stm->output_stream == (pa_stream *)0x0) {
      iVar3 = 0;
    }
    else {
      pcVar2 = (*cubeb_pa_stream_get_device_name)(stm->output_stream);
      iVar3 = 0;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = strdup(pcVar2);
      }
      (*device)->output_name = pcVar2;
    }
  }
  return iVar3;
}

Assistant:

static int
pulse_stream_get_current_device(cubeb_stream * stm,
                                cubeb_device ** const device)
{
#if PA_CHECK_VERSION(0, 9, 8)
  *device = calloc(1, sizeof(cubeb_device));
  if (*device == NULL)
    return CUBEB_ERROR;

  if (stm->input_stream) {
    const char * name = WRAP(pa_stream_get_device_name)(stm->input_stream);
    (*device)->input_name = (name == NULL) ? NULL : strdup(name);
  }

  if (stm->output_stream) {
    const char * name = WRAP(pa_stream_get_device_name)(stm->output_stream);
    (*device)->output_name = (name == NULL) ? NULL : strdup(name);
  }

  return CUBEB_OK;
#else
  return CUBEB_ERROR_NOT_SUPPORTED;
#endif
}